

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O2

void ssh1_set_wants_user_input(ConnectionLayer *cl,_Bool wanted)

{
  undefined3 in_register_00000031;
  
  *(_Bool *)((long)&cl[-10].logctx + 4) = wanted;
  *(undefined1 *)((long)&cl[-5].logctx + 1) = 1;
  if (CONCAT31(in_register_00000031,wanted) != 0) {
    ssh_check_sendok((Ssh *)cl[6].vt);
    return;
  }
  return;
}

Assistant:

static void ssh1_set_wants_user_input(ConnectionLayer *cl, bool wanted)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);

    s->want_user_input = wanted;
    s->finished_setup = true;
    if (wanted)
        ssh_check_sendok(s->ppl.ssh);
}